

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall chrono::ChAparticle::ArchiveOUT(ChAparticle *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChAparticle>(marchive);
  ChFrameMoving<double>::ArchiveOUT((ChFrameMoving<double> *)this,marchive);
  local_38._value = (ChVector<double> *)&this->collision_model;
  local_38._name = "collision_model";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::collision::ChCollisionModel>
            (marchive,(ChNameValue<chrono::collision::ChCollisionModel_*> *)&local_38);
  local_38._value = &this->UserForce;
  local_38._name = "UserForce";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->UserTorque;
  local_38._name = "UserTorque";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChAparticle::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChAparticle>();

    // serialize parent class
    ChParticleBase::ArchiveOUT(marchive);

    // serialize all member data:
    // marchive << CHNVP(container);
    marchive << CHNVP(collision_model);
    marchive << CHNVP(UserForce);
    marchive << CHNVP(UserTorque);
}